

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

void __thiscall arealights::Application::onUpdate(Application *this,duration *deltaTime)

{
  ofstream *this_00;
  int iVar1;
  pointer ppVar2;
  pointer pcVar3;
  element_type *peVar4;
  char cVar5;
  int iVar6;
  ostream *poVar7;
  pointer ppVar8;
  float fVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  materialNames;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  this->_frame = this->_frame + 1;
  fw::ImGuiApplication::onUpdate(&this->super_ImGuiApplication,deltaTime);
  (this->_cameraInputMapper)._locked = this->_cameraLocked;
  FreeCameraInputMapper::update(&this->_cameraInputMapper,deltaTime);
  this->_restartIncrementalRendering = (this->_cameraInputMapper)._hadMovement;
  Interface::render(&this->_interface);
  this->_restartIncrementalRendering = (this->_cameraInputMapper)._hadMovement;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar8 = (this->_materialMap).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Material>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Material>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->_materialMap).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Material>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Material>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar8 != ppVar2) {
    do {
      pcVar3 = (ppVar8->first)._M_dataplus._M_p;
      local_88._0_8_ = &local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar3,pcVar3 + (ppVar8->first)._M_string_length);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_88.field_0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._0_8_ != &local_78) {
        operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity + 1);
      }
      ppVar8 = ppVar8 + 1;
    } while (ppVar8 != ppVar2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->_interface)._materialNames,&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  iVar6 = (*(((this->_keyboardInput).
              super___shared_ptr<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_IKeyboardInput)._vptr_IKeyboardInput[4])();
  if ((char)iVar6 != '\0') {
    this->_screenshotRequested = true;
    std::__cxx11::string::_M_replace
              ((ulong)&this->_screenshotAnnotation,0,
               (char *)(this->_screenshotAnnotation)._M_string_length,0x1c315f);
  }
  peVar4 = (this->_keyboardInput).
           super___shared_ptr<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar6 = (*(peVar4->super_IKeyboardInput)._vptr_IKeyboardInput[4])(peVar4,0x49);
  if ((char)iVar6 != '\0') {
    this->_restartIncrementalRendering = true;
  }
  peVar4 = (this->_keyboardInput).
           super___shared_ptr<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar6 = (*(peVar4->super_IKeyboardInput)._vptr_IKeyboardInput[4])(peVar4,0x4c);
  if ((char)iVar6 != '\0') {
    this->_cameraLocked = (bool)(this->_cameraLocked ^ 1);
  }
  peVar4 = (this->_keyboardInput).
           super___shared_ptr<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar6 = (*(peVar4->super_IKeyboardInput)._vptr_IKeyboardInput[4])(peVar4,0x31);
  if ((char)iVar6 != '\0') {
    local_88._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x40000000400;
    fw::OpenGLApplication::setWindowSize((OpenGLApplication *)this,(ivec2 *)&local_88.field_0);
  }
  peVar4 = (this->_keyboardInput).
           super___shared_ptr<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar6 = (*(peVar4->super_IKeyboardInput)._vptr_IKeyboardInput[4])(peVar4,0x32);
  if ((char)iVar6 != '\0') {
    local_88._0_8_ = 0x3e860a92;
    local_88.field_0.z = 0.0;
    fw::FreeCamera::setEulerAngles
              ((this->_camera).super___shared_ptr<fw::FreeCamera,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ,(vec3 *)&local_88.field_0);
    local_88._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x3f00000000000000;
    local_88.field_0.z = 5.0;
    fw::FreeCamera::setWorldPosition
              ((this->_camera).super___shared_ptr<fw::FreeCamera,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ,(vec3 *)&local_88.field_0);
  }
  peVar4 = (this->_keyboardInput).
           super___shared_ptr<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar6 = (*(peVar4->super_IKeyboardInput)._vptr_IKeyboardInput[4])(peVar4,0x33);
  if ((char)iVar6 != '\0') {
    local_88._0_8_ = 0xbf490fdb00000000;
    local_88.field_0.z = 0.0;
    fw::FreeCamera::setEulerAngles
              ((this->_camera).super___shared_ptr<fw::FreeCamera,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ,(vec3 *)&local_88.field_0);
    local_88._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x3e99999a40a00000;
    local_88.field_0.z = 5.0;
    fw::FreeCamera::setWorldPosition
              ((this->_camera).super___shared_ptr<fw::FreeCamera,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ,(vec3 *)&local_88.field_0);
  }
  peVar4 = (this->_keyboardInput).
           super___shared_ptr<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar6 = (*(peVar4->super_IKeyboardInput)._vptr_IKeyboardInput[4])(peVar4,0x35);
  if ((char)iVar6 != '\0') {
    this->_autoscreenshot = true;
    this->_autoscreenshotStep = 0;
    this->_autoscreenshotFrame = 0;
  }
  if (this->_autoscreenshot == true) {
    if (this->_autoscreenshotStep < 6) {
      if (this->_autoscreenshotStep == 0 && this->_autoscreenshotFrame == 0) {
        std::ofstream::open((char *)&this->_autoscreenshotOutFile,0x1a487e);
      }
      iVar6 = 5;
      if ((this->_interface)._selectedArealightMethod == AREALIGHT_GROUNDTRUTH) {
        iVar6 = 1000;
      }
      this->_timeSum = this->_frameTimeMs + this->_timeSum;
      if (this->_autoscreenshotFrame == (this->_autoscreenshotStep + 1) * iVar6) {
        this_00 = &this->_autoscreenshotOutFile;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"method=",7);
        std::ostream::operator<<((ostream *)this_00,(this->_interface)._selectedArealightMethod);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\rroughness=",0xb);
        fVar9 = (float)this->_autoscreenshotStep * 0.2;
        if (fVar9 <= 0.05) {
          fVar9 = 0.05;
        }
        std::ostream::_M_insert<double>((double)fVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\rtime=",6);
        fVar9 = this->_timeSum;
        if ((this->_interface)._selectedArealightMethod != AREALIGHT_GROUNDTRUTH) {
          fVar9 = fVar9 / (float)iVar6;
        }
        poVar7 = std::ostream::_M_insert<double>((double)fVar9);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        this->_autoscreenshotStep = this->_autoscreenshotStep + 1;
      }
      iVar1 = this->_autoscreenshotStep;
      if ((iVar1 < 6) && (this->_autoscreenshotFrame == iVar1 * iVar6)) {
        fVar9 = (float)iVar1 * 0.2;
        if (fVar9 <= 0.05) {
          fVar9 = 0.05;
        }
        (this->_interface)._roughness = fVar9;
        this->_timeSum = 0.0;
        this->_restartIncrementalRendering = true;
      }
      if (this->_autoscreenshotFrame == (iVar1 + 1) * iVar6 + -1) {
        this->_screenshotRequested = true;
      }
      this->_autoscreenshotFrame = this->_autoscreenshotFrame + 1;
    }
    else {
      this->_autoscreenshot = false;
      cVar5 = std::__basic_file<char>::is_open();
      if (cVar5 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&this->_autoscreenshotOutFile,"Closing.",8);
        std::ofstream::close();
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return;
}

Assistant:

void Application::onUpdate(
    const std::chrono::high_resolution_clock::duration& deltaTime
)
{
    ++_frame;

    ImGuiApplication::onUpdate(deltaTime);

    _cameraInputMapper.setLock(_cameraLocked);
    _cameraInputMapper.update(deltaTime);
    _restartIncrementalRendering = _cameraInputMapper.hadMovement();

    _interface.render();

    _restartIncrementalRendering = _cameraInputMapper.hadMovement();

    std::vector<std::string> materialNames;
    std::transform(std::begin(_materialMap), std::end(_materialMap), std::back_inserter(materialNames),
        [](const std::pair<std::string, std::shared_ptr<Material>> &p) { return p.first; });

    _interface.setMaterials(materialNames);

    if (_keyboardInput->isKeyTapped(GLFW_KEY_P)) {
        _screenshotRequested = true;
        _screenshotAnnotation = "";
    }

    if (_keyboardInput->isKeyTapped(GLFW_KEY_I)) {
        _restartIncrementalRendering = true;
    }

    if (_keyboardInput->isKeyTapped(GLFW_KEY_L)) {
        _cameraLocked = !_cameraLocked;
    }

    // Automate screenshot taking

    if (_keyboardInput->isKeyTapped(GLFW_KEY_1)) {
        this->setWindowSize({1024, 1024});
    }

    if (_keyboardInput->isKeyTapped(GLFW_KEY_2)) {
        _camera->setEulerAngles({M_PI*(1.0/12.0), 0, 0});
        _camera->setWorldPosition({0, 0.5, 5});
    }

    if (_keyboardInput->isKeyTapped(GLFW_KEY_3)) {
        _camera->setEulerAngles({0, -M_PI_4, 0});
        _camera->setWorldPosition({5, 0.3, 5});
    }

    if (_keyboardInput->isKeyTapped(GLFW_KEY_5)) {
        _autoscreenshot = true;
        _autoscreenshotStep = 0;
        _autoscreenshotFrame = 0;
    }

    /*
    // Average time measurements
    if (_keyboardInput->isKeyTapped(GLFW_KEY_M)) {
        _measure = true;
        _measureAccumulator = 0.0f;
        _measureFramesNum = 0;
    }

    if (_measure) {
        if (_measureFramesNum < 100) {
            _measureAccumulator += _frameTimeMs;
            ++_measureFramesNum;
        } else {
            _measure = false;
            _lastMeasurement = _measureAccumulator / 100.0f;
        }
    }

    ImGui::Text("Last measurement: %.4f", _lastMeasurement);
    */


    // Autoscreenshoting for paper purposes
    if (_autoscreenshot) {
        if (_autoscreenshotStep <= 5) {
            if (_autoscreenshotStep == 0 && _autoscreenshotFrame == 0) {
                _autoscreenshotOutFile.open("autoscreenshot_log.txt", std::ios_base::app);
            }

            const int numFrames = _interface.getArealightMethod() == AREALIGHT_GROUNDTRUTH ? 1000 : 5;

            _timeSum += _frameTimeMs;

            // finalize previous step - all frames done for this one
            if (_autoscreenshotFrame == numFrames * (_autoscreenshotStep+1)) {
                // log time
                _autoscreenshotOutFile << "method=" << static_cast<int>(_interface.getArealightMethod());
                _autoscreenshotOutFile << "\rroughness=" << std::max(0.05f, _autoscreenshotStep * 0.2f);
                _autoscreenshotOutFile << "\rtime=" << (_interface.getArealightMethod() == AREALIGHT_GROUNDTRUTH ?
                    _timeSum :
                    _timeSum / numFrames) << std::endl;
                // go to next step
                ++_autoscreenshotStep;
            }

            // first frame of the new step
            if (_autoscreenshotStep <= 5 && _autoscreenshotFrame == numFrames * _autoscreenshotStep) {
                _interface.setRoughness(std::max(0.05f, _autoscreenshotStep * 0.2f));
                _timeSum = 0.0;
                _restartIncrementalRendering = true;
            }

            // ground truth needs a few frames, that's why there is a waiting period, also for other methods we
            // calculate average for gen time
            // last frame of current step
            if (_autoscreenshotFrame == numFrames * (_autoscreenshotStep + 1) - 1) {
                _screenshotRequested = true;
            }

            ++_autoscreenshotFrame;
        } else {
            _autoscreenshot = false;
            if (_autoscreenshotOutFile.is_open()) {
                _autoscreenshotOutFile << "Closing.";
                _autoscreenshotOutFile.close();
            }
        }
    }
}